

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::generateNewIdentifier(BrokerBase *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  genId_abi_cxx11_();
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->identifier,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this->uuid_like = false;
  return;
}

Assistant:

void BrokerBase::generateNewIdentifier()
{
    identifier = genId();
    uuid_like = false;
}